

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool google::protobuf::anon_unknown_20::CheckParseInputSize
               (StringPiece input,ErrorCollector *error_collector)

{
  char *pcVar1;
  char *pcVar2;
  char *i;
  char *f;
  AlphaNum local_140;
  AlphaNum local_110;
  char *local_e0;
  undefined8 local_d8;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  i = input.ptr_;
  if (0x7fffffff < (long)i) {
    local_e0 = "Input size too large: ";
    local_d8 = 0x16;
    pcVar1 = local_b0.digits;
    local_b0.piece_data_ = pcVar1;
    pcVar2 = FastInt64ToBufferLeft((int64)i,pcVar1);
    local_b0.piece_size_ = (long)pcVar2 - (long)pcVar1;
    f = " bytes";
    local_140.piece_data_ = " > ";
    local_140.piece_size_ = 3;
    pcVar1 = local_80.digits;
    local_80.piece_data_ = pcVar1;
    pcVar2 = FastInt32ToBufferLeft(0x7fffffff,pcVar1);
    local_80.piece_size_ = (long)pcVar2 - (long)pcVar1;
    local_110.piece_data_ = " bytes.";
    local_110.piece_size_ = 7;
    StrCat_abi_cxx11_(&local_50,(protobuf *)&local_e0,&local_b0,(AlphaNum *)&stack0xfffffffffffffe90
                      ,&local_140,&local_80,&local_110,(AlphaNum *)f);
    (**(code **)(*(long *)input.length_ + 0x10))((long *)input.length_,0xffffffff,0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return (long)i < 0x80000000;
}

Assistant:

bool CheckParseInputSize(StringPiece input,
                         io::ErrorCollector* error_collector) {
  if (input.size() > INT_MAX) {
    error_collector->AddError(
        -1, 0,
        StrCat("Input size too large: ", static_cast<int64>(input.size()),
                     " bytes", " > ", INT_MAX, " bytes."));
    return false;
  }
  return true;
}